

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_poisondamage_Iii_Actor
               (AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  int iVar1;
  int iVar2;
  
  iVar1 = params[2].i;
  iVar2 = params[3].i;
  defaults->PoisonDamage = params[1].i;
  if (params->i == 1) {
    defaults->PoisonDuration = -0x80000000;
    return;
  }
  defaults->PoisonDuration = iVar1;
  if (2 < params->i) {
    defaults->PoisonPeriod = iVar2;
    return;
  }
  defaults->PoisonPeriod = 0;
  return;
}

Assistant:

DEFINE_PROPERTY(poisondamage, Iii, Actor)
{
	PROP_INT_PARM(poisondamage, 0);
	PROP_INT_PARM(poisonduration, 1);
	PROP_INT_PARM(poisonperiod, 2);

	defaults->PoisonDamage = poisondamage;
	if (PROP_PARM_COUNT == 1)
	{
		defaults->PoisonDuration = INT_MIN;
	}
	else
	{
		defaults->PoisonDuration = poisonduration;

		if (PROP_PARM_COUNT > 2)
			defaults->PoisonPeriod = poisonperiod;
		else
			defaults->PoisonPeriod = 0;
	}
}